

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::RTI_IP(CPU *this)

{
  uint16_t uVar1;
  int iVar2;
  byte bVar3;
  
  this->cycles = 5;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(this->sp + 0x101));
  bVar3 = this->sp + 1;
  this->sp = bVar3;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (uint8_t)iVar2;
  uVar1 = ReadWord(this,bVar3 + 0x101);
  this->sp = this->sp + '\x02';
  this->cycles = this->cycles - 1;
  this->pc = uVar1;
  return;
}

Assistant:

void CPU::RTI_IP()
{
    cycles = 6;
    ps = GetStackByte();
    pc = GetStackWord();
}